

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O2

int Lpk_CountSupp(Abc_Ntk_t *p,Vec_Ptr_t *vNodes)

{
  uint *puVar1;
  Abc_Obj_t *p_00;
  int iVar2;
  long *plVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  
  iVar4 = 0;
  for (iVar6 = 0; iVar2 = vNodes->nSize, iVar6 < iVar2; iVar6 = iVar6 + 1) {
    plVar3 = (long *)Vec_PtrEntry(vNodes,iVar6);
    for (lVar5 = 0; lVar5 < *(int *)((long)plVar3 + 0x1c); lVar5 = lVar5 + 1) {
      p_00 = *(Abc_Obj_t **)
              (*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)(plVar3[4] + lVar5 * 4) * 8)
      ;
      iVar2 = Abc_NodeIsTravIdCurrent(p_00);
      if (iVar2 == 0) {
        iVar4 = (iVar4 + 1) - (uint)((*(uint *)&p_00->field_0x14 >> 9 & 1) != 0);
        *(uint *)&p_00->field_0x14 = *(uint *)&p_00->field_0x14 | 0x200;
      }
    }
  }
  for (iVar6 = 0; iVar6 < iVar2; iVar6 = iVar6 + 1) {
    plVar3 = (long *)Vec_PtrEntry(vNodes,iVar6);
    for (lVar5 = 0; lVar5 < *(int *)((long)plVar3 + 0x1c); lVar5 = lVar5 + 1) {
      puVar1 = (uint *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                 (long)*(int *)(plVar3[4] + lVar5 * 4) * 8) + 0x14);
      *puVar1 = *puVar1 & 0xfffffdff;
    }
    iVar2 = vNodes->nSize;
  }
  return iVar4;
}

Assistant:

int Lpk_CountSupp( Abc_Ntk_t * p, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pObj, * pFanin; 
    int i, k, Count = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            if ( Abc_NodeIsTravIdCurrent(pFanin) )
                continue;
            Count += !pFanin->fPersist;
            pFanin->fPersist = 1;
        }
    }
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            pFanin->fPersist = 0;
    return Count;
}